

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

void __thiscall
IntrusiveList<ExprVariableDefinition>::push_back
          (IntrusiveList<ExprVariableDefinition> *this,ExprVariableDefinition *node)

{
  uint __line;
  ExprVariableDefinition **ppEVar1;
  char *__assertion;
  bool bVar2;
  
  if (node == (ExprVariableDefinition *)0x0) {
    __assertion = "node";
    __line = 0xf;
  }
  else if ((node->super_ExprBase).next == (ExprBase *)0x0) {
    if ((node->super_ExprBase).listed != true) {
      (node->super_ExprBase).listed = true;
      bVar2 = this->head != (ExprVariableDefinition *)0x0;
      ppEVar1 = (ExprVariableDefinition **)&(this->tail->super_ExprBase).next;
      if (!bVar2) {
        ppEVar1 = &this->tail;
      }
      *ppEVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assertion = "!node->listed";
    __line = 0x11;
  }
  else {
    __assertion = "node->next == 0";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,__line,
                "void IntrusiveList<ExprVariableDefinition>::push_back(T *) [T = ExprVariableDefinition]"
               );
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}